

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnAtomicLoadExpr
          (BinaryReaderIR *this,Opcode opcode,Index memidx,Address alignment_log2,Address offset)

{
  char *__s;
  Offset OVar1;
  Result RVar2;
  tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_> this_00;
  Location loc;
  __uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_> local_110;
  Location local_108;
  Location local_e8;
  Var local_c0;
  Var local_78;
  
  local_108.field_1.field_0.line = 0;
  local_108.field_1.field_0.first_column = 0;
  local_108.field_1.field_0.last_column = 0;
  local_108.filename._M_len = 0;
  local_108.filename._M_str._0_4_ = 0;
  local_108.filename._M_str._4_4_ = 0;
  __s = this->filename_;
  local_108.filename._M_len = strlen(__s);
  local_108.filename._M_str._0_4_ = SUB84(__s,0);
  local_108.filename._M_str._4_4_ = (undefined4)((ulong)__s >> 0x20);
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_108.field_1.field_0.line = (int)OVar1;
  local_108.field_1.field_0.first_column = (int)(OVar1 >> 0x20);
  Var::Var(&local_c0,memidx,&local_108);
  this_00.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)operator_new(0xa0);
  Var::Var(&local_78,&local_c0);
  local_e8.field_1.field_0.line = 0;
  local_e8.field_1._4_8_ = 0;
  local_e8.filename._M_len = 0;
  local_e8.filename._M_str._0_4_ = 0;
  local_e8.filename._M_str._4_4_ = 0;
  LoadStoreExpr<(wabt::ExprType)0>::LoadStoreExpr
            ((LoadStoreExpr<(wabt::ExprType)0> *)
             this_00.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl,opcode,&local_78,
             (long)(1 << ((byte)alignment_log2 & 0x1f)),offset,&local_e8);
  Var::~Var(&local_78);
  local_110._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
       (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
       (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
       this_00.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
       super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
  RVar2 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_110);
  if ((_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
      local_110._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl != (Expr *)0x0) {
    (**(code **)(*(long *)local_110._M_t.
                          super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 8))();
  }
  local_110._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
       (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
       (_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)0x0;
  Var::~Var(&local_c0);
  return (Result)RVar2.enum_;
}

Assistant:

Result BinaryReaderIR::OnAtomicLoadExpr(Opcode opcode,
                                        Index memidx,
                                        Address alignment_log2,
                                        Address offset) {
  return AppendExpr(std::make_unique<AtomicLoadExpr>(
      opcode, Var(memidx, GetLocation()), 1 << alignment_log2, offset));
}